

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

Expression * __thiscall
wasm::
Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
::replaceCurrent(Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                 *this,Expression *expression)

{
  Function *pFVar1;
  undefined8 uVar2;
  const_iterator cVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  Expression **ppEVar6;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *this_00;
  Expression *local_38;
  Expression *local_30;
  
  ppEVar6 = this->replacep;
  pFVar1 = this->currFunction;
  if (pFVar1 != (Function *)0x0) {
    local_38 = *ppEVar6;
    if ((pFVar1->debugLocations)._M_h._M_element_count != 0) {
      this_00 = &pFVar1->debugLocations;
      local_30 = expression;
      cVar3 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&local_30);
      if (cVar3.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        iVar4 = std::
                _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,&local_38);
        if (iVar4.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          pmVar5 = std::__detail::
                   _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&local_30);
          uVar2 = *(undefined8 *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                          ._M_cur + 0x18);
          *(undefined8 *)
           &(pmVar5->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
               *(undefined8 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur + 0x10);
          *(undefined8 *)
           ((long)&(pmVar5->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
           + 8) = uVar2;
          *(undefined8 *)
           ((long)&(pmVar5->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
                   ._M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
                   _M_payload + 4) =
               *(undefined8 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur + 0x20);
        }
      }
    }
    ppEVar6 = this->replacep;
  }
  *ppEVar6 = expression;
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      debuginfo::copyOriginalToReplacement(
        getCurrent(), expression, currFunction);
    }
    return *replacep = expression;
  }